

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O1

void __thiscall Assimp::FIBoolValueImpl::~FIBoolValueImpl(FIBoolValueImpl *this)

{
  pointer pcVar1;
  
  (this->super_FIBoolValue).super_FIValue._vptr_FIValue =
       (_func_int **)&PTR_toString_abi_cxx11__009d0c00;
  pcVar1 = (this->strValue)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->strValue).field_2) {
    operator_delete(pcVar1);
  }
  (this->super_FIBoolValue).super_FIValue._vptr_FIValue =
       (_func_int **)&PTR___cxa_pure_virtual_009d0c40;
  std::_Bvector_base<std::allocator<bool>_>::_M_deallocate
            (&(this->super_FIBoolValue).value.super__Bvector_base<std::allocator<bool>_>);
  operator_delete(this);
  return;
}

Assistant:

inline FIBoolValueImpl(std::vector<bool> &&value_): strValueValid(false) { value = std::move(value_); }